

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O1

void ParseArguments(int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  runtime_error *this;
  char **ppcVar7;
  allocator local_59;
  char *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  iVar3 = argc + -1;
  if (iVar3 != 0) {
    do {
      ppcVar7 = argv + 1;
      pcVar2 = argv[1];
      iVar4 = iVar3;
      if (*pcVar2 == '-') {
        bVar1 = pcVar2[1];
        pcVar2 = s_filename;
        if (bVar1 < 0x6f) {
          if (bVar1 == 0x62) {
            if (argc == 2) {
              this = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(this,"filename required for -b");
              goto LAB_0010bd76;
            }
            s_boot_rom_filename = argv[2];
LAB_0010bd2b:
            ppcVar7 = argv + 2;
            iVar4 = argc + -2;
            pcVar2 = s_filename;
          }
          else if (bVar1 == 0x66) {
            if (argc != 2) {
              std::__cxx11::string::string((string *)local_50,argv[2],&local_59);
              pcVar2 = local_50[0];
              piVar5 = __errno_location();
              iVar3 = *piVar5;
              *piVar5 = 0;
              lVar6 = strtol(pcVar2,&local_58,10);
              if (local_58 != pcVar2) {
                iVar4 = (int)lVar6;
                if ((iVar4 == lVar6) && (*piVar5 != 0x22)) {
                  if (*piVar5 == 0) {
                    *piVar5 = iVar3;
                  }
                  s_frames = iVar4;
                  if (local_50[0] != local_40) {
                    operator_delete(local_50[0]);
                  }
                  goto LAB_0010bd2b;
                }
                std::__throw_out_of_range("stoi");
              }
              std::__throw_invalid_argument("stoi");
            }
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"frame count required for -f");
            goto LAB_0010bd76;
          }
        }
        else {
          if (bVar1 == 0x6f) {
            if (argc != 2) {
              s_ppm_filename = argv[2];
              goto LAB_0010bd2b;
            }
            this = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(this,"filename required for -o");
            goto LAB_0010bd76;
          }
          if (bVar1 == 0x74) {
            s_trace = 1;
          }
        }
      }
      else if (s_filename != (char *)0x0) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this,"multiple filenames");
        goto LAB_0010bd76;
      }
      s_filename = pcVar2;
      iVar3 = iVar4 + -1;
      argv = ppcVar7;
      argc = iVar4;
    } while (iVar3 != 0);
  }
  if (s_filename != (char *)0x0) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"No rom file given.");
LAB_0010bd76:
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ParseArguments(int argc, char** argv) {
  --argc;
  ++argv;
  for (; argc; --argc, ++argv) {
    const char* arg = *argv;
    if (arg[0] == '-') {
      switch (arg[1]) {
        case 'f':
          if (--argc == 0) {
            throw Error("frame count required for -f");
          }
          try {
            s_frames = std::stoi(*++argv);
          } catch (const std::invalid_argument&) {
            throw Error("invalid frame count");
          }
          break;

        case 't':
          s_trace = true;
          break;

        case 'o':
          if (--argc == 0) {
            throw Error("filename required for -o");
          }
          s_ppm_filename = *++argv;
          break;

        case 'b':
          if (--argc == 0) {
            throw Error("filename required for -b");
          }
          s_boot_rom_filename = *++argv;
          break;
      }
    } else if (s_filename) {
      throw Error("multiple filenames");
    } else {
      s_filename = arg;
    }
  }

  if (!s_filename) {
    throw Error("No rom file given.");
  }
}